

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O2

void __thiscall CNetAddr::CNetAddr(CNetAddr *this,in6_addr *ipv6Addr,uint32_t scope)

{
  long in_FS_OFFSET;
  Span<const_unsigned_char> ipv6;
  uchar local_21;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_21 = '\0';
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector(&this->m_addr,0x10,&local_21);
  this->m_net = NET_IPV6;
  this->m_scope_id = 0;
  ipv6.m_size = 0x10;
  ipv6.m_data = (uchar *)ipv6Addr;
  SetLegacyIPv6(this,ipv6);
  this->m_scope_id = scope;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CNetAddr::CNetAddr(const struct in6_addr& ipv6Addr, const uint32_t scope)
{
    SetLegacyIPv6({reinterpret_cast<const uint8_t*>(&ipv6Addr), sizeof(ipv6Addr)});
    m_scope_id = scope;
}